

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_formatter.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::price::subject::SubjectFormatter::NumericCharacterEntity::NumericCharacterEntity
          (NumericCharacterEntity *this,vector<char,_std::allocator<char>_> *encodings)

{
  _Rb_tree_header *p_Var1;
  char *pcVar2;
  char *pcVar3;
  
  p_Var1 = &(this->encodings_table_)._M_t._M_impl.super__Rb_tree_header;
  (this->encodings_table_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->encodings_table_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->encodings_table_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->encodings_table_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->encodings_table_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  AddCharacterEncoding(this,'&');
  pcVar2 = (encodings->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pcVar3 = (encodings->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_start; pcVar3 != pcVar2; pcVar3 = pcVar3 + 1) {
    AddCharacterEncoding(this,*pcVar3);
  }
  return;
}

Assistant:

SubjectFormatter::NumericCharacterEntity::NumericCharacterEntity(std::vector<char> encodings)
{
    AddCharacterEncoding('&');

    for (char c : encodings)
    {
        AddCharacterEncoding(c);
    }
}